

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O3

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
is_dominated_by<boost::container::flat_set<int,std::less<int>,void>>
          (Flag_complex_edge_collapser<int,float> *this,flat_set<int,_std::less<int>,_void> *e_ngb,
          int c,float f)

{
  int *piVar1;
  int *piVar2;
  stored_size_type sVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  
  sVar3 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
          m_data.m_seq.m_holder.m_size;
  if (sVar3 == 0) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = float, Ngb = boost::container::flat_set<int>]"
                 );
  }
  lVar4 = *(long *)(*(long *)this + 8 + (long)c * 0x18);
  if (lVar4 == 0) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = float, Ngb = boost::container::flat_set<int>]"
                 );
  }
  piVar5 = *(int **)(*(long *)this + (long)c * 0x18);
  piVar1 = piVar5 + lVar4 * 2;
  piVar6 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
           m_data.m_seq.m_holder.m_start;
  piVar2 = piVar6 + sVar3;
  while( true ) {
    if (piVar6 == (int *)0x0) {
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                    "reference boost::container::vec_iterator<int *, true>::operator*() const [Pointer = int *, IsConst = true]"
                   );
    }
    while (*piVar5 < *piVar6) {
      piVar5 = piVar5 + 2;
      if (piVar5 == piVar1) {
        return false;
      }
    }
    if (*piVar6 < *piVar5) {
      return false;
    }
    if (f < (float)piVar5[1]) {
      return false;
    }
    piVar6 = piVar6 + 1;
    if (piVar6 == piVar2) break;
    piVar5 = piVar5 + 2;
    if (piVar5 == piVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }